

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

void __thiscall FIX::DataDictionary::readFromStream(DataDictionary *this,istream *stream)

{
  char cVar1;
  tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_> this_00;
  ConfigError *this_01;
  allocator<char> local_49;
  __uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> local_48;
  string local_40;
  
  this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       operator_new(0xd8);
  PUGIXML_DOMDocument::PUGIXML_DOMDocument
            ((PUGIXML_DOMDocument *)
             this_00.
             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
             super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
  local_48._M_t.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
       super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  cVar1 = (**(code **)(*(long *)this_00.
                                super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl +
                      0x10))(this_00.
                             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                             .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,stream);
  if (cVar1 != '\0') {
    readFromDocument(this,(DOMDocumentPtr *)&local_48);
    (**(code **)(*(long *)this_00.
                          super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                          .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl + 8))
              (this_00.
               super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
               super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
    return;
  }
  this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Could not parse data dictionary stream",&local_49);
  ConfigError::ConfigError(this_01,&local_40);
  __cxa_throw(this_01,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());

  if (!pDoc->load(stream)) {
    throw ConfigError("Could not parse data dictionary stream");
  }

  readFromDocument(pDoc);
}